

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O0

void __thiscall
BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage
          (BayesianGameForDecPOMDPStage *this,BayesianGameForDecPOMDPStage *o)

{
  vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *this_00;
  ulong uVar1;
  size_type sVar2;
  const_reference ppJVar3;
  long in_RSI;
  undefined8 *in_RDI;
  Index k;
  BayesianGameForDecPOMDPStageInterface *in_stack_ffffffffffffff68;
  BayesianGameForDecPOMDPStageInterface *in_stack_ffffffffffffff70;
  BayesianGameIdenticalPayoff *in_stack_ffffffffffffff78;
  BayesianGameIdenticalPayoff *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *in_stack_ffffffffffffffc0;
  
  BayesianGameForDecPOMDPStageInterface::BayesianGameForDecPOMDPStageInterface
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  BayesianGameIdenticalPayoff::BayesianGameIdenticalPayoff
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *in_RDI = &PTR__BayesianGameForDecPOMDPStage_00d06940;
  in_RDI[4] = &PTR__BayesianGameForDecPOMDPStage_00d06990;
  in_RDI[0x21] = *(undefined8 *)(in_RSI + 0x108);
  in_RDI[0x22] = *(undefined8 *)(in_RSI + 0x110);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)0x8b6258);
  *(byte *)(in_RDI + 0x26) = *(byte *)(in_RSI + 0x130) & 1;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(in_stack_ffffffffffffffc0,
           (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  this_00 = (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
            std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
                      ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                       (in_RSI + 0x118));
  std::allocator<JointBeliefInterface_*>::allocator((allocator<JointBeliefInterface_*> *)0x8b62c6);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::vector
            (this_00,in_stack_ffffffffffffff88,(value_type *)in_stack_ffffffffffffff80,
             (allocator_type *)in_stack_ffffffffffffff78);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::operator=
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
             in_stack_ffffffffffffff80,
             (vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
             in_stack_ffffffffffffff78);
  std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::~vector
            ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
             in_stack_ffffffffffffff80);
  std::allocator<JointBeliefInterface_*>::~allocator((allocator<JointBeliefInterface_*> *)0x8b630b);
  uVar4 = 0;
  while( true ) {
    uVar1 = (ulong)uVar4;
    sVar2 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::size
                      ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                       (in_RSI + 0x118));
    if (uVar1 == sVar2) break;
    ppJVar3 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                        ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                         in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
    if (*ppJVar3 != (value_type)0x0) {
      ppJVar3 = std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                          ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                            *)in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff70 =
           (BayesianGameForDecPOMDPStageInterface *)(**(code **)((long)**ppJVar3 + 0xb8))();
      in_stack_ffffffffffffff68 =
           (BayesianGameForDecPOMDPStageInterface *)
           std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::at
                     ((vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                      in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff68->_vptr_BayesianGameForDecPOMDPStageInterface =
           (_func_int **)in_stack_ffffffffffffff70;
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::BayesianGameForDecPOMDPStage(const BayesianGameForDecPOMDPStage& o) 
    :
        BayesianGameForDecPOMDPStageInterface( o ),
        //BayesianGameBase( o ),
        BayesianGameIdenticalPayoff ( o )
        ,_m_pu(o._m_pu)
        ,_m_qHeuristic(o._m_qHeuristic)
        ,_m_areCachedImmediateRewards(o._m_areCachedImmediateRewards)
        ,_m_immR(o._m_immR) //does this work for std::vector< std::vector<double> > ? gues so?
{
    //make deep copy of beliefs in _m_JB
    _m_JBs=std::vector< JointBeliefInterface* >(o._m_JBs.size(),0);
    for(Index k=0;k!=o._m_JBs.size();++k)
    {
        if(o._m_JBs.at(k))
            _m_JBs.at(k)=o._m_JBs.at(k)->Clone();
    }
}